

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.cpp
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderV::build
          (BVHNBuilderV *this,FastAllocator *allocator,BuildProgressMonitor *progressFunc,
          PrimRef *prims,PrimInfo *pinfo,Settings settings)

{
  NodeRefPtr<4> NVar1;
  anon_class_8_1_8991fb9c createLeafFunc;
  
  settings.branchingFactor = 4;
  settings.maxDepth = 0x28;
  createLeafFunc.this = this;
  NVar1 = BVHBuilderBinnedSAH::
          build<embree::NodeRefPtr<4>,embree::FastAllocator::Create,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set3,embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderV::build(embree::FastAllocator*,embree::BuildProgressMonitor&,embree::PrimRef*,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&,embree::sse2::GeneralBVHBuilder::Settings)::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::BuildProgressMonitor>
                    (allocator,allocator,prims,&createLeafFunc,progressFunc,prims,pinfo,&settings);
  return (NodeRef)NVar1.ptr;
}

Assistant:

typename BVHN<N>::NodeRef BVHNBuilderVirtual<N>::BVHNBuilderV::build(FastAllocator* allocator, BuildProgressMonitor& progressFunc, PrimRef* prims, const PrimInfo& pinfo, GeneralBVHBuilder::Settings settings)
    {
      auto createLeafFunc = [&] (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) -> NodeRef {
        return createLeaf(prims,set,alloc);
      };
      
      settings.branchingFactor = N;
      settings.maxDepth = BVH::maxBuildDepthLeaf;
      return BVHBuilderBinnedSAH::build<NodeRef>
        (FastAllocator::Create(allocator),typename BVH::AABBNode::Create2(),typename BVH::AABBNode::Set3(allocator,prims),createLeafFunc,progressFunc,prims,pinfo,settings);
    }